

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void __thiscall EDCircles::EDCircles(EDCircles *this,Mat *srcImage)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  Circle *pCVar11;
  size_type sVar12;
  reference pvVar13;
  int *piVar14;
  BufferManager *pBVar15;
  reference pvVar16;
  Info *pIVar17;
  EDArcs *pEVar18;
  long lVar19;
  int iVar20;
  Circle *local_418;
  Circle *local_3f0;
  double local_398;
  Circle *local_358;
  Point_<double> local_318;
  mCircle local_308;
  double local_2f0;
  double yc_2;
  double xc_2;
  double r_2;
  Size local_2c8;
  Point_<double> local_2c0;
  mEllipse local_2b0;
  double local_290;
  double theta;
  double b;
  double a;
  double yc_1;
  double xc_1;
  EllipseEquation eq_1;
  int i_4;
  int i_3;
  _OutputArray local_220;
  _InputArray local_208;
  vector<LineSegment,_std::allocator<LineSegment>_> local_1f0;
  int local_1d4;
  double dStack_1d0;
  int maxNoOfCircles;
  double dotProduct;
  double v2Len;
  double v2y;
  double v2x;
  double v1Len;
  double v1y;
  double v1x;
  double d_1;
  double dy_1;
  double dx_1;
  LineSegment *l2;
  LineSegment *l1;
  int j_1;
  int i_2;
  double tmp;
  double minor;
  double major;
  double ellipseFitError;
  EllipseEquation eq;
  double circleFitError;
  double r_1;
  double yc;
  double xc;
  double maxDistanceBetweenEndPoints;
  double r;
  double d;
  double dy;
  double dx;
  double *pdStack_c0;
  int j;
  double *y;
  double *x;
  int noPixels;
  int i_1;
  vector<LineSegment,_std::allocator<LineSegment>_> lines;
  int local_88;
  int i;
  int bufferSize;
  Mat local_78 [96];
  Mat *local_18;
  Mat *srcImage_local;
  EDCircles *this_local;
  
  local_18 = srcImage;
  srcImage_local = (Mat *)this;
  cv::Mat::Mat(local_78,srcImage);
  EDPF::EDPF(&this->super_EDPF,local_78);
  cv::Mat::~Mat(local_78);
  std::vector<mCircle,_std::allocator<mCircle>_>::vector(&this->circles);
  std::vector<mEllipse,_std::allocator<mEllipse>_>::vector(&this->ellipses);
  this->noCircles1 = 0;
  uVar9 = (ulong)(((this->super_EDPF).super_ED.width + (this->super_EDPF).super_ED.height) * 8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar9;
  uVar10 = SUB168(auVar2 * ZEXT816(0x98),0);
  if (SUB168(auVar2 * ZEXT816(0x98),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pCVar11 = (Circle *)operator_new__(uVar10);
  if (uVar9 != 0) {
    local_358 = pCVar11;
    do {
      Circle::Circle(local_358);
      local_358 = local_358 + 1;
    } while (local_358 != pCVar11 + uVar9);
  }
  this->circles1 = pCVar11;
  local_88 = 0;
  for (lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar9 = (ulong)lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
      sVar12 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::size(&(this->super_EDPF).super_ED.segmentPoints), uVar9 < sVar12;
      lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar13 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[](&(this->super_EDPF).super_ED.segmentPoints,
                           (long)lines.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    sVar12 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar13);
    local_88 = (int)sVar12 + local_88;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)((this->super_EDPF).super_ED.segmentNos + 1);
  uVar9 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar9);
  this->segmentStartLines = piVar14;
  pBVar15 = (BufferManager *)operator_new(0x18);
  BufferManager::BufferManager(pBVar15,local_88 << 3);
  this->bm = pBVar15;
  std::vector<LineSegment,_std::allocator<LineSegment>_>::vector
            ((vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels);
  x._4_4_ = 0;
  do {
    if ((this->super_EDPF).super_ED.segmentNos <= x._4_4_) {
      sVar12 = std::vector<LineSegment,_std::allocator<LineSegment>_>::size
                         ((vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels);
      this->segmentStartLines[(this->super_EDPF).super_ED.segmentNos] = (int)sVar12;
      sVar12 = std::vector<LineSegment,_std::allocator<LineSegment>_>::size
                         ((vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar12;
      uVar9 = SUB168(auVar4 * ZEXT816(0x18),0);
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pIVar17 = (Info *)operator_new__(uVar9);
      this->info = pIVar17;
      for (l1._4_4_ = 0; l1._4_4_ < (this->super_EDPF).super_ED.segmentNos; l1._4_4_ = l1._4_4_ + 1)
      {
        for (l1._0_4_ = this->segmentStartLines[l1._4_4_];
            (int)l1 < this->segmentStartLines[l1._4_4_ + 1]; l1._0_4_ = (int)l1 + 1) {
          l2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                         ((vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels,
                          (long)(int)l1);
          if ((int)l1 == this->segmentStartLines[l1._4_4_ + 1] + -1) {
            dx_1 = (double)std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                     ((vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels
                                      ,(long)this->segmentStartLines[l1._4_4_]);
          }
          else {
            dx_1 = (double)std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                     ((vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels
                                      ,(long)((int)l1 + 1));
          }
          dy_1 = l2->ex - *(double *)((long)dx_1 + 0x18);
          d_1 = l2->ey - *(double *)((long)dx_1 + 0x20);
          v1x = sqrt(dy_1 * dy_1 + d_1 * d_1);
          if (v1x < 15.0) {
            v1y = l2->ex - l2->sx;
            v1Len = l2->ey - l2->sy;
            v2x = sqrt(v1y * v1y + v1Len * v1Len);
            v2y = *(double *)((long)dx_1 + 0x28) - *(double *)((long)dx_1 + 0x18);
            v2Len = *(double *)((long)dx_1 + 0x30) - *(double *)((long)dx_1 + 0x20);
            dotProduct = sqrt(v2y * v2y + v2Len * v2Len);
            dStack_1d0 = (v1y * v2y + v1Len * v2Len) / (v2x * dotProduct);
            if (dStack_1d0 <= 1.0) {
              if (dStack_1d0 < -1.0) {
                dStack_1d0 = -1.0;
              }
            }
            else {
              dStack_1d0 = 1.0;
            }
            dVar7 = acos(dStack_1d0);
            this->info[(int)l1].angle = dVar7;
            iVar20 = -1;
            if (0.0 <= v1y * v2Len + -(v2y * v1Len)) {
              iVar20 = 1;
            }
            this->info[(int)l1].sign = iVar20;
            this->info[(int)l1].taken = false;
          }
          else {
            this->info[(int)l1].angle = 10.0;
            this->info[(int)l1].sign = 2;
            this->info[(int)l1].taken = false;
          }
        }
      }
      sVar12 = std::vector<LineSegment,_std::allocator<LineSegment>_>::size
                         ((vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels);
      local_1d4 = (int)sVar12 / 3 + this->noCircles1 * 2;
      pEVar18 = (EDArcs *)operator_new(0x10);
      EDArcs::EDArcs(pEVar18,local_1d4);
      this->edarcs1 = pEVar18;
      std::vector<LineSegment,_std::allocator<LineSegment>_>::vector
                (&local_1f0,(vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels);
      DetectArcs(this,&local_1f0);
      std::vector<LineSegment,_std::allocator<LineSegment>_>::~vector(&local_1f0);
      pEVar18 = (EDArcs *)operator_new(0x10);
      EDArcs::EDArcs(pEVar18,local_1d4);
      this->edarcs2 = pEVar18;
      JoinArcs1(this);
      pEVar18 = (EDArcs *)operator_new(0x10);
      EDArcs::EDArcs(pEVar18,local_1d4);
      this->edarcs3 = pEVar18;
      JoinArcs2(this);
      pEVar18 = (EDArcs *)operator_new(0x10);
      EDArcs::EDArcs(pEVar18,local_1d4);
      this->edarcs4 = pEVar18;
      JoinArcs3(this);
      GenerateCandidateCircles(this);
      this->noCircles2 = 0;
      uVar9 = (ulong)local_1d4;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar9;
      uVar10 = SUB168(auVar5 * ZEXT816(0x98),0);
      if (SUB168(auVar5 * ZEXT816(0x98),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      pCVar11 = (Circle *)operator_new__(uVar10);
      if (uVar9 != 0) {
        local_3f0 = pCVar11;
        do {
          Circle::Circle(local_3f0);
          local_3f0 = local_3f0 + 1;
        } while (local_3f0 != pCVar11 + uVar9);
      }
      this->circles2 = pCVar11;
      cv::_InputArray::_InputArray(&local_208,srcImage);
      cv::_OutputArray::_OutputArray(&local_220,&(this->super_EDPF).super_ED.smoothImage);
      cv::Size_<int>::Size_((Size_<int> *)&i_4);
      cv::GaussianBlur(0,&local_208,&local_220,&i_4,4);
      cv::_OutputArray::~_OutputArray(&local_220);
      cv::_InputArray::~_InputArray(&local_208);
      ValidateCircles(this);
      this->noCircles3 = 0;
      uVar9 = (ulong)local_1d4;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar9;
      uVar10 = SUB168(auVar6 * ZEXT816(0x98),0);
      if (SUB168(auVar6 * ZEXT816(0x98),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      pCVar11 = (Circle *)operator_new__(uVar10);
      if (uVar9 != 0) {
        local_418 = pCVar11;
        do {
          Circle::Circle(local_418);
          local_418 = local_418 + 1;
        } while (local_418 != pCVar11 + uVar9);
      }
      this->circles3 = pCVar11;
      JoinCircles(this);
      this->noCircles = 0;
      this->noEllipses = 0;
      for (eq_1.coeff[6]._4_4_ = 0; eq_1.coeff[6]._4_4_ < this->noCircles3;
          eq_1.coeff[6]._4_4_ = eq_1.coeff[6]._4_4_ + 1) {
        if ((this->circles3[eq_1.coeff[6]._4_4_].isEllipse & 1U) == 0) {
          this->noCircles = this->noCircles + 1;
        }
        else {
          this->noEllipses = this->noEllipses + 1;
        }
      }
      for (eq_1.coeff[6]._0_4_ = 0; eq_1.coeff[6]._0_4_ < this->noCircles3;
          eq_1.coeff[6]._0_4_ = eq_1.coeff[6]._0_4_ + 1) {
        if ((this->circles3[eq_1.coeff[6]._0_4_].isEllipse & 1U) == 0) {
          xc_2 = this->circles3[eq_1.coeff[6]._0_4_].r;
          yc_2 = this->circles3[eq_1.coeff[6]._0_4_].xc;
          local_2f0 = this->circles3[eq_1.coeff[6]._0_4_].yc;
          cv::Point_<double>::Point_(&local_318,yc_2,local_2f0);
          mCircle::mCircle(&local_308,&local_318,xc_2);
          std::vector<mCircle,_std::allocator<mCircle>_>::push_back(&this->circles,&local_308);
        }
        else {
          pCVar11 = this->circles3;
          lVar19 = (long)eq_1.coeff[6]._0_4_;
          eq_1.coeff[5] = pCVar11[lVar19].eq.coeff[6];
          xc_1 = pCVar11[lVar19].eq.coeff[0];
          eq_1.coeff[0] = pCVar11[lVar19].eq.coeff[1];
          pdVar1 = pCVar11[lVar19].eq.coeff + 2;
          eq_1.coeff[1] = *pdVar1;
          eq_1.coeff[2] = pdVar1[1];
          pdVar1 = pCVar11[lVar19].eq.coeff + 4;
          eq_1.coeff[3] = *pdVar1;
          eq_1.coeff[4] = pdVar1[1];
          local_290 = ComputeEllipseCenterAndAxisLengths
                                ((EllipseEquation *)&xc_1,&yc_1,&a,&b,&theta);
          cv::Point_<double>::Point_(&local_2c0,yc_1,a);
          cv::Size_<double>::Size_((Size_<double> *)&r_2,b,theta);
          cv::Size_::operator_cast_to_Size_((Size_ *)&local_2c8);
          mEllipse::mEllipse(&local_2b0,&local_2c0,&local_2c8,local_290);
          std::vector<mEllipse,_std::allocator<mEllipse>_>::push_back(&this->ellipses,&local_2b0);
        }
      }
      pEVar18 = this->edarcs1;
      if (pEVar18 != (EDArcs *)0x0) {
        EDArcs::~EDArcs(pEVar18);
        operator_delete(pEVar18);
      }
      pEVar18 = this->edarcs2;
      if (pEVar18 != (EDArcs *)0x0) {
        EDArcs::~EDArcs(pEVar18);
        operator_delete(pEVar18);
      }
      pEVar18 = this->edarcs3;
      if (pEVar18 != (EDArcs *)0x0) {
        EDArcs::~EDArcs(pEVar18);
        operator_delete(pEVar18);
      }
      pEVar18 = this->edarcs4;
      if (pEVar18 != (EDArcs *)0x0) {
        EDArcs::~EDArcs(pEVar18);
        operator_delete(pEVar18);
      }
      if (this->circles1 != (Circle *)0x0) {
        operator_delete__(this->circles1);
      }
      if (this->circles2 != (Circle *)0x0) {
        operator_delete__(this->circles2);
      }
      if (this->circles3 != (Circle *)0x0) {
        operator_delete__(this->circles3);
      }
      pBVar15 = this->bm;
      if (pBVar15 != (BufferManager *)0x0) {
        BufferManager::~BufferManager(pBVar15);
        operator_delete(pBVar15);
      }
      if (this->segmentStartLines != (int *)0x0) {
        operator_delete__(this->segmentStartLines);
      }
      if (this->info != (Info *)0x0) {
        operator_delete__(this->info);
      }
      std::vector<LineSegment,_std::allocator<LineSegment>_>::~vector
                ((vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels);
      return;
    }
    sVar12 = std::vector<LineSegment,_std::allocator<LineSegment>_>::size
                       ((vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels);
    this->segmentStartLines[x._4_4_] = (int)sVar12;
    pvVar13 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[](&(this->super_EDPF).super_ED.segmentPoints,(long)x._4_4_);
    sVar12 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar13);
    x._0_4_ = (int)sVar12;
    if ((int)x < 0xc) goto LAB_00113267;
    y = BufferManager::getX(this->bm);
    pdStack_c0 = BufferManager::getY(this->bm);
    for (dx._4_4_ = 0; dx._4_4_ < (int)x; dx._4_4_ = dx._4_4_ + 1) {
      pvVar13 = std::
                vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ::operator[](&(this->super_EDPF).super_ED.segmentPoints,(long)x._4_4_);
      pvVar16 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                          (pvVar13,(long)dx._4_4_);
      y[dx._4_4_] = (double)pvVar16->x;
      pvVar13 = std::
                vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ::operator[](&(this->super_EDPF).super_ED.segmentPoints,(long)x._4_4_);
      pvVar16 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                          (pvVar13,(long)dx._4_4_);
      pdStack_c0[dx._4_4_] = (double)pvVar16->y;
    }
    if ((int)x < 0x18) {
LAB_0011322f:
      EDLines::SplitSegment2Lines
                (y,pdStack_c0,(int)x,x._4_4_,
                 (vector<LineSegment,_std::allocator<LineSegment>_> *)&noPixels,6,1.0);
    }
    else {
      dy = *y - y[(int)x + -1];
      d = *pdStack_c0 - pdStack_c0[(int)x + -1];
      r = sqrt(dy * dy + d * d);
      maxDistanceBetweenEndPoints = (double)(int)x / 6.283185307179586;
      if (maxDistanceBetweenEndPoints / 4.0 <= 3.0) {
        local_398 = 3.0;
      }
      else {
        local_398 = maxDistanceBetweenEndPoints / 4.0;
      }
      xc = local_398;
      if (local_398 < r) goto LAB_0011322f;
      eq.coeff[6] = 10000000000.0;
      CircleFit(y,pdStack_c0,(int)x,&yc,&r_1,&circleFitError,eq.coeff + 6);
      EllipseEquation::EllipseEquation((EllipseEquation *)&ellipseFitError);
      major = 10000000000.0;
      if ((1.5 < eq.coeff[6]) &&
         (bVar8 = EllipseFit(y,pdStack_c0,(int)x,(EllipseEquation *)&ellipseFitError,1), bVar8)) {
        major = ComputeEllipseError((EllipseEquation *)&ellipseFitError,y,pdStack_c0,(int)x);
      }
      if (1.5 < eq.coeff[6]) {
        if (1.5 < major) goto LAB_0011322f;
        ComputeEllipseCenterAndAxisLengths((EllipseEquation *)&ellipseFitError,&yc,&r_1,&minor,&tmp)
        ;
        dVar7 = minor;
        if (minor < tmp) {
          _j_1 = minor;
          minor = tmp;
          tmp = dVar7;
        }
        if (minor < tmp * 8.0) {
          addCircle(this->circles1,&this->noCircles1,yc,r_1,circleFitError,eq.coeff[6],
                    (EllipseEquation *)&ellipseFitError,major,y,pdStack_c0,(int)x);
          BufferManager::move(this->bm,(int)x);
        }
      }
      else {
        addCircle(this->circles1,&this->noCircles1,yc,r_1,circleFitError,eq.coeff[6],y,pdStack_c0,
                  (int)x);
        BufferManager::move(this->bm,(int)x);
      }
    }
LAB_00113267:
    x._4_4_ = x._4_4_ + 1;
  } while( true );
}

Assistant:

EDCircles::EDCircles(Mat srcImage)
	: EDPF(srcImage)
{
	// Arcs & circles to be detected
	// If the end-points of the segment is very close to each other, 
	// then directly fit a circle/ellipse instread of line fitting
	noCircles1 = 0;
	circles1 = new Circle[(width + height) * 8];

	// ----------------------------------- DETECT LINES ---------------------------------
	int bufferSize = 0;
	for (int i = 0; i < segmentPoints.size(); i++) 
		bufferSize += (int)segmentPoints[i].size();

	// Compute the starting line number for each segment
	segmentStartLines = new int[segmentNos + 1];

	bm = new BufferManager(bufferSize * 8);
	vector<LineSegment> lines;


#define CIRCLE_MIN_LINE_LEN 6

	for (int i = 0; i < segmentNos; i++) {

		// Make note of the starting line number for this segment
		segmentStartLines[i] = (int)lines.size();

		int noPixels = (int)segmentPoints[i].size();

		if (noPixels < 2 * CIRCLE_MIN_LINE_LEN) 
			continue;

		double *x = bm->getX();
		double *y = bm->getY();

		for (int j = 0; j<noPixels; j++) {
			x[j] = segmentPoints[i][j].x;
			y[j] = segmentPoints[i][j].y;
		} //end-for

		  // If the segment is reasonably long, then see if the segment traverses the boundary of a closed shape
		if (noPixels >= 4 * CIRCLE_MIN_LINE_LEN) {
			// If the end-points of the segment is close to each other, then assume a circular/elliptic structure
			double dx = x[0] - x[noPixels - 1];
			double dy = y[0] - y[noPixels - 1];
			double d = sqrt(dx*dx + dy*dy);
			double r = noPixels / TWOPI;      // Assume a complete circle

			double maxDistanceBetweenEndPoints = MAX(3, r / 4);

			// If almost closed loop, then try to fit a circle/ellipse
			if (d <= maxDistanceBetweenEndPoints) {
				double xc, yc, r, circleFitError = 1e10;

				CircleFit(x, y, noPixels, &xc, &yc, &r, &circleFitError);

				EllipseEquation eq;
				double ellipseFitError = 1e10;

				if (circleFitError > LONG_ARC_ERROR) {
					// Try fitting an ellipse
					if (EllipseFit(x, y, noPixels, &eq)) 
						ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);
				} //end-if

				if (circleFitError <= LONG_ARC_ERROR) {
					addCircle(circles1, noCircles1, xc ,yc, r, circleFitError, x, y, noPixels);
					bm->move(noPixels);
					continue;

				}
				else if (ellipseFitError <= ELLIPSE_ERROR) {
					double major, minor;
					ComputeEllipseCenterAndAxisLengths(&eq, &xc, &yc, &major, &minor);

					// Assume major is longer. Otherwise, swap
					if (minor > major) { double tmp = major; major = minor; minor = tmp; }

					if (major < 8 * minor) {
						addCircle(circles1, noCircles1,xc, yc, r, circleFitError, &eq, ellipseFitError, x, y, noPixels);
						bm->move(noPixels);
					} //end-if

					continue;
				} //end-else
			} //end-if 
		} //end-if
		
		// Otherwise, split to lines
		EDLines::SplitSegment2Lines(x, y, noPixels, i, lines);
	}

	segmentStartLines[segmentNos] = (int)lines.size();

	// ------------------------------- DETECT ARCS ---------------------------------

	info = new Info[lines.size()];

	// Compute the angle information for each line segment
	for (int i = 0; i<segmentNos; i++) {
		for (int j = segmentStartLines[i]; j<segmentStartLines[i + 1]; j++) {
			LineSegment *l1 = &lines[j];
			LineSegment *l2;

			if (j == segmentStartLines[i + 1] - 1) l2 = &lines[segmentStartLines[i]];
			else                               l2 = &lines[j + 1];

#if 1
			// If the end points of the lines are far from each other, then stop at this line
			double dx = l1->ex - l2->sx;
			double dy = l1->ey - l2->sy;
			double d = sqrt(dx*dx + dy*dy);
			if (d >= 15) { info[j].angle = 10; info[j].sign = 2; info[j].taken = false; continue; }
#endif

			// Compute the angle between the lines & their turn direction
			double v1x = l1->ex - l1->sx;
			double v1y = l1->ey - l1->sy;
			double v1Len = sqrt(v1x*v1x + v1y*v1y);

			double v2x = l2->ex - l2->sx;
			double v2y = l2->ey - l2->sy;
			double v2Len = sqrt(v2x*v2x + v2y*v2y);

			double dotProduct = (v1x*v2x + v1y*v2y) / (v1Len*v2Len);
			if (dotProduct > 1.0) dotProduct = 1.0;
			else if (dotProduct < -1.0) dotProduct = -1.0;

			info[j].angle = acos(dotProduct);
			info[j].sign = (v1x*v2y - v2x*v1y) >= 0 ? 1 : -1;  // compute cross product
			info[j].taken = false;
		} //end-for
	} //end-for

	// This is how much space we will allocate for circles buffers
	int maxNoOfCircles = (int)lines.size() / 3 + noCircles1 * 2;

	edarcs1 = new EDArcs(maxNoOfCircles);
	DetectArcs(lines);    // Detect all arcs

	// Try to join arcs that are almost perfectly circular. 
	// Use the distance between the arc end-points as a metric in choosing in choosing arcs to join
	edarcs2 = new EDArcs(maxNoOfCircles);
	JoinArcs1();

	// Try to join arcs that belong to the same segment
	edarcs3 = new EDArcs(maxNoOfCircles);
	JoinArcs2();

	// Try to combine arcs that belong to different segments
	edarcs4 = new EDArcs(maxNoOfCircles);     // The remaining arcs
	JoinArcs3();

	// Finally, go over the arcs & circles, and generate candidate circles
	GenerateCandidateCircles();

	//----------------------------- VALIDATE CIRCLES --------------------------
	noCircles2 = 0;
	circles2 = new Circle[maxNoOfCircles];
	GaussianBlur(srcImage, smoothImage, Size(), 0.50); // calculate kernel from sigma;

	ValidateCircles();

	//----------------------------- JOIN CIRCLES --------------------------
	noCircles3 = 0;
	circles3 = new Circle[maxNoOfCircles];
	JoinCircles();

	noCircles = 0;
	noEllipses = 0;
	for (int i = 0; i < noCircles3; i++) {
		if (circles3[i].isEllipse)
			noEllipses++;
		else
			noCircles++;
	}

	for (int i = 0; i<noCircles3; i++) {
		if (circles3[i].isEllipse) {
			EllipseEquation eq = circles3[i].eq;
			double xc;
			double yc;
			double a;
			double b;
			double theta = ComputeEllipseCenterAndAxisLengths(&eq, &xc, &yc, &a, &b);
			ellipses.push_back(mEllipse(Point2d(xc, yc), Size2d(a, b), theta));

		}
		else {
			double r = circles3[i].r;
			double xc = circles3[i].xc;
			double yc = circles3[i].yc;

			circles.push_back(mCircle(Point2d(xc, yc), r));
			
		} //end-else
	} //end-for


	// clean up
	delete edarcs1;
	delete edarcs2;
	delete edarcs3;
	delete edarcs4;

	delete[] circles1;
	delete[] circles2;
	delete[] circles3;

	delete bm;
	delete[] segmentStartLines;
	delete[] info;
}